

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O1

void mbedtls_entropy_init(mbedtls_entropy_context *ctx)

{
  int iVar1;
  long lVar2;
  
  memset(ctx,0,0x400);
  mbedtls_sha512_starts(&ctx->accumulator,0);
  iVar1 = ctx->source_count;
  lVar2 = (long)iVar1;
  if (lVar2 < 0x14) {
    ctx->source[lVar2].f_source = mbedtls_platform_entropy_poll;
    ctx->source[lVar2].p_source = (void *)0x0;
    ctx->source[lVar2].threshold = 0x20;
    ctx->source[lVar2].strong = 1;
    ctx->source_count = iVar1 + 1;
  }
  iVar1 = ctx->source_count;
  lVar2 = (long)iVar1;
  if (lVar2 < 0x14) {
    ctx->source[lVar2].f_source = mbedtls_hardclock_poll;
    ctx->source[lVar2].p_source = (void *)0x0;
    ctx->source[lVar2].threshold = 4;
    ctx->source[lVar2].strong = 0;
    ctx->source_count = iVar1 + 1;
  }
  return;
}

Assistant:

void mbedtls_entropy_init( mbedtls_entropy_context *ctx )
{
    memset( ctx, 0, sizeof(mbedtls_entropy_context) );

#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_init( &ctx->mutex );
#endif

#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
    mbedtls_sha512_starts( &ctx->accumulator, 0 );
#else
    mbedtls_sha256_starts( &ctx->accumulator, 0 );
#endif
#if defined(MBEDTLS_HAVEGE_C)
    mbedtls_havege_init( &ctx->havege_data );
#endif

#if !defined(MBEDTLS_NO_DEFAULT_ENTROPY_SOURCES)
#if !defined(MBEDTLS_NO_PLATFORM_ENTROPY)
    mbedtls_entropy_add_source( ctx, mbedtls_platform_entropy_poll, NULL,
                                MBEDTLS_ENTROPY_MIN_PLATFORM,
                                MBEDTLS_ENTROPY_SOURCE_STRONG );
#endif
#if defined(MBEDTLS_TIMING_C)
    mbedtls_entropy_add_source( ctx, mbedtls_hardclock_poll, NULL,
                                MBEDTLS_ENTROPY_MIN_HARDCLOCK,
                                MBEDTLS_ENTROPY_SOURCE_WEAK );
#endif
#if defined(MBEDTLS_HAVEGE_C)
    mbedtls_entropy_add_source( ctx, mbedtls_havege_poll, &ctx->havege_data,
                                MBEDTLS_ENTROPY_MIN_HAVEGE,
                                MBEDTLS_ENTROPY_SOURCE_STRONG );
#endif
#if defined(MBEDTLS_ENTROPY_HARDWARE_ALT)
    mbedtls_entropy_add_source( ctx, mbedtls_hardware_poll, NULL,
                                MBEDTLS_ENTROPY_MIN_HARDWARE,
                                MBEDTLS_ENTROPY_SOURCE_STRONG );
#endif
#endif /* MBEDTLS_NO_DEFAULT_ENTROPY_SOURCES */
}